

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts3InitTokenizer(Fts3Hash *pHash,char *zArg,sqlite3_tokenizer **ppTok,char **pzErr)

{
  sqlite3_tokenizer_module *psVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  Fts3HashElem *pFVar6;
  char **p;
  char **pOld;
  long lVar7;
  long lVar8;
  u64 nBytes;
  long in_FS_OFFSET;
  int n;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  __s = sqlite3_mprintf("%s");
  iVar2 = 7;
  if (__s != (char *)0x0) {
    sVar3 = strlen(__s);
    pcVar4 = sqlite3Fts3NextToken(__s,&local_3c);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = __s;
    }
    lVar8 = (long)local_3c;
    pcVar4[lVar8] = '\0';
    sqlite3Fts3Dequote(pcVar4);
    sVar5 = strlen(pcVar4);
    pFVar6 = sqlite3Fts3HashFindElem(pHash,pcVar4,(int)sVar5 + 1);
    if ((pFVar6 == (Fts3HashElem *)0x0) ||
       (psVar1 = (sqlite3_tokenizer_module *)pFVar6->data, psVar1 == (sqlite3_tokenizer_module *)0x0
       )) {
      sqlite3Fts3ErrMsg(pzErr,"unknown tokenizer: %s",pcVar4);
      iVar2 = 1;
    }
    else {
      pcVar4 = pcVar4 + lVar8 + 1;
      if (pcVar4 < __s + sVar3) {
        nBytes = 8;
        lVar8 = 0;
        pOld = (char **)0x0;
        do {
          pcVar4 = sqlite3Fts3NextToken(pcVar4,&local_3c);
          p = pOld;
          if (pcVar4 == (char *)0x0) break;
          iVar2 = sqlite3_initialize();
          if ((iVar2 != 0) || (p = (char **)sqlite3Realloc(pOld,nBytes), p == (char **)0x0)) {
            sqlite3_free(__s);
            sqlite3_free(pOld);
            iVar2 = 7;
            goto LAB_001c88db;
          }
          p[lVar8] = pcVar4;
          lVar7 = (long)local_3c;
          pcVar4[lVar7] = '\0';
          sqlite3Fts3Dequote(pcVar4);
          pcVar4 = pcVar4 + lVar7 + 1;
          nBytes = nBytes + 8;
          lVar8 = lVar8 + 1;
          pOld = p;
        } while (pcVar4 < __s + sVar3);
      }
      else {
        lVar8 = 0;
        p = (char **)0x0;
      }
      iVar2 = (*psVar1->xCreate)((int)lVar8,p,ppTok);
      if (iVar2 == 0) {
        (*ppTok)->pModule = psVar1;
      }
      else {
        sqlite3Fts3ErrMsg(pzErr,"unknown tokenizer");
      }
      sqlite3_free(p);
    }
    sqlite3_free(__s);
  }
LAB_001c88db:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3InitTokenizer(
  Fts3Hash *pHash,                /* Tokenizer hash table */
  const char *zArg,               /* Tokenizer name */
  sqlite3_tokenizer **ppTok,      /* OUT: Tokenizer (if applicable) */
  char **pzErr                    /* OUT: Set to malloced error message */
){
  int rc;
  char *z = (char *)zArg;
  int n = 0;
  char *zCopy;
  char *zEnd;                     /* Pointer to nul-term of zCopy */
  sqlite3_tokenizer_module *m;

  zCopy = sqlite3_mprintf("%s", zArg);
  if( !zCopy ) return SQLITE_NOMEM;
  zEnd = &zCopy[strlen(zCopy)];

  z = (char *)sqlite3Fts3NextToken(zCopy, &n);
  if( z==0 ){
    assert( n==0 );
    z = zCopy;
  }
  z[n] = '\0';
  sqlite3Fts3Dequote(z);

  m = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,z,(int)strlen(z)+1);
  if( !m ){
    sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer: %s", z);
    rc = SQLITE_ERROR;
  }else{
    char const **aArg = 0;
    int iArg = 0;
    z = &z[n+1];
    while( z<zEnd && (NULL!=(z = (char *)sqlite3Fts3NextToken(z, &n))) ){
      sqlite3_int64 nNew = sizeof(char *)*(iArg+1);
      char const **aNew = (const char **)sqlite3_realloc64((void *)aArg, nNew);
      if( !aNew ){
        sqlite3_free(zCopy);
        sqlite3_free((void *)aArg);
        return SQLITE_NOMEM;
      }
      aArg = aNew;
      aArg[iArg++] = z;
      z[n] = '\0';
      sqlite3Fts3Dequote(z);
      z = &z[n+1];
    }
    rc = m->xCreate(iArg, aArg, ppTok);
    assert( rc!=SQLITE_OK || *ppTok );
    if( rc!=SQLITE_OK ){
      sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer");
    }else{
      (*ppTok)->pModule = m;
    }
    sqlite3_free((void *)aArg);
  }

  sqlite3_free(zCopy);
  return rc;
}